

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAddr.cpp
# Opt level: O0

Error __thiscall
llvm::DWARFDebugAddrTable::extract
          (DWARFDebugAddrTable *this,DWARFDataExtractor Data,uint64_t *OffsetPtr,uint16_t Version,
          uint8_t AddrSize,function<void_(llvm::Error)> *WarnCallback)

{
  uint64_t uVar1;
  bool bVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  size_t sVar6;
  undefined7 in_register_00000009;
  undefined6 in_register_00000012;
  function<void_(llvm::Error)> *in_R9;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  error_code EC_03;
  error_code EC_04;
  error_code EC_05;
  error_code EC_06;
  error_code EC_07;
  error_code EC_08;
  error_code EC_09;
  Error local_138;
  uint64_t local_130;
  ulong local_128;
  uint local_120;
  uint local_11c;
  uint32_t I;
  uint32_t AddrCount;
  error_category *local_110;
  error_code local_108;
  error_code local_f8;
  error_code local_e8;
  error_code local_d8;
  error_code local_c8;
  error_code local_b8;
  uint32_t local_a4;
  long lStack_a0;
  uint32_t TmpLength_1;
  uint64_t End;
  error_category *local_90;
  uint32_t local_84;
  undefined1 local_80 [4];
  uint32_t TmpLength;
  error_category *local_78;
  error_code local_60;
  Error local_50;
  ushort local_42;
  undefined1 local_40 [6];
  uint16_t UnitVersion;
  error_category *local_38;
  function<void_(llvm::Error)> *WarnCallback_local;
  uint8_t AddrSize_local;
  uint64_t *puStack_20;
  uint16_t Version_local;
  uint64_t *OffsetPtr_local;
  DWARFDebugAddrTable *this_local;
  
  puStack_20 = (uint64_t *)CONCAT62(in_register_00000012,Version);
  WarnCallback_local._5_1_ = (char)WarnCallback;
  WarnCallback_local._6_2_ = (ushort)CONCAT71(in_register_00000009,AddrSize);
  OffsetPtr_local = OffsetPtr;
  this_local = this;
  clear((DWARFDebugAddrTable *)OffsetPtr);
  OffsetPtr[1] = *puStack_20;
  bVar2 = DataExtractor::isValidOffsetForDataOfSize(&Data.super_DataExtractor,*puStack_20,4);
  if (!bVar2) {
    std::error_code::error_code<llvm::errc,void>((error_code *)local_40,invalid_argument);
    EC._M_cat._0_4_ = local_40._0_4_;
    EC._0_8_ = this;
    EC._M_cat._4_4_ = 0;
    createStringError<unsigned_long>
              (EC,(char *)local_38,
               (unsigned_long *)
               "section is not large enough to contain a .debug_addr table length at offset 0x%lx");
    return (Error)(ErrorInfoBase *)this;
  }
  if (WarnCallback_local._6_2_ == 0) {
    std::error_code::error_code<llvm::errc,void>(&local_60,invalid_argument);
    EC_00._M_cat._0_4_ = local_60._M_value;
    EC_00._0_8_ = &local_50;
    EC_00._M_cat._4_4_ = 0;
    createStringError(EC_00,(char *)local_60._M_cat);
    std::function<void_(llvm::Error)>::operator()(in_R9,&local_50);
    Error::~Error(&local_50);
    local_42 = 5;
  }
  else {
    local_42 = WarnCallback_local._6_2_;
  }
  *(undefined1 *)OffsetPtr = 0;
  if (local_42 < 5) {
    *(ushort *)((long)OffsetPtr + 0x14) = local_42;
    *(char *)((long)OffsetPtr + 0x16) = WarnCallback_local._5_1_;
    *(undefined1 *)((long)OffsetPtr + 0x17) = 0;
    sVar6 = DWARFDataExtractor::size(&Data);
    *(int *)(OffsetPtr + 3) = (int)sVar6;
  }
  else {
    uVar5 = DataExtractor::getU32(&Data.super_DataExtractor,puStack_20,(Error *)0x0);
    *(uint32_t *)(OffsetPtr + 2) = uVar5;
    if ((int)OffsetPtr[2] == -1) {
      invalidateLength((DWARFDebugAddrTable *)OffsetPtr);
      std::error_code::error_code<llvm::errc,void>((error_code *)local_80,not_supported);
      EC_01._M_cat._0_4_ = local_80;
      EC_01._0_8_ = this;
      EC_01._M_cat._4_4_ = 0;
      createStringError<unsigned_long>
                (EC_01,(char *)local_78,
                 (unsigned_long *)"DWARF64 is not supported in .debug_addr at offset 0x%lx");
      return (Error)(ErrorInfoBase *)this;
    }
    if ((ulong)(uint)OffsetPtr[2] + 4 < 8) {
      local_84 = getLength((DWARFDebugAddrTable *)OffsetPtr);
      invalidateLength((DWARFDebugAddrTable *)OffsetPtr);
      std::error_code::error_code<llvm::errc,void>((error_code *)&End,invalid_argument);
      EC_02._M_cat._0_4_ = (undefined4)End;
      EC_02._0_8_ = this;
      EC_02._M_cat._4_4_ = 0;
      createStringError<unsigned_long,unsigned_int>
                (EC_02,(char *)local_90,
                 (unsigned_long *)
                 ".debug_addr table at offset 0x%lx has too small length (0x%x) to contain a complete header"
                 ,(uint *)(OffsetPtr + 1));
      return (Error)(ErrorInfoBase *)this;
    }
    uVar1 = OffsetPtr[1];
    uVar5 = getLength((DWARFDebugAddrTable *)OffsetPtr);
    lStack_a0 = uVar1 + uVar5;
    bVar2 = DataExtractor::isValidOffsetForDataOfSize
                      (&Data.super_DataExtractor,OffsetPtr[1],lStack_a0 - OffsetPtr[1]);
    if (!bVar2) {
      local_a4 = getLength((DWARFDebugAddrTable *)OffsetPtr);
      invalidateLength((DWARFDebugAddrTable *)OffsetPtr);
      std::error_code::error_code<llvm::errc,void>(&local_b8,invalid_argument);
      EC_03._M_cat._0_4_ = local_b8._M_value;
      EC_03._0_8_ = this;
      EC_03._M_cat._4_4_ = 0;
      createStringError<unsigned_int,unsigned_long>
                (EC_03,(char *)local_b8._M_cat,
                 (uint *)
                 "section is not large enough to contain a .debug_addr table of length 0x%x at offset 0x%lx"
                 ,(unsigned_long *)&local_a4);
      return (Error)(ErrorInfoBase *)this;
    }
    uVar4 = DataExtractor::getU16(&Data.super_DataExtractor,puStack_20,(Error *)0x0);
    *(uint16_t *)((long)OffsetPtr + 0x14) = uVar4;
    uVar3 = DataExtractor::getU8(&Data.super_DataExtractor,puStack_20,(Error *)0x0);
    *(uint8_t *)((long)OffsetPtr + 0x16) = uVar3;
    uVar3 = DataExtractor::getU8(&Data.super_DataExtractor,puStack_20,(Error *)0x0);
    *(uint8_t *)((long)OffsetPtr + 0x17) = uVar3;
    uVar5 = getDataSize((DWARFDebugAddrTable *)OffsetPtr);
    *(uint32_t *)(OffsetPtr + 3) = uVar5;
  }
  if (*(ushort *)((long)OffsetPtr + 0x14) < 6) {
    if (*(ushort *)((long)OffsetPtr + 0x14) == local_42) {
      if ((*(char *)((long)OffsetPtr + 0x16) == '\x04') ||
         (*(char *)((long)OffsetPtr + 0x16) == '\b')) {
        if ((*(char *)((long)OffsetPtr + 0x16) == WarnCallback_local._5_1_) ||
           (WarnCallback_local._5_1_ == '\0')) {
          if (*(char *)((long)OffsetPtr + 0x17) == '\0') {
            if ((uint)OffsetPtr[3] % (uint)*(byte *)((long)OffsetPtr + 0x16) == 0) {
              DataExtractor::setAddressSize
                        (&Data.super_DataExtractor,*(uint8_t *)((long)OffsetPtr + 0x16));
              local_11c = (uint)OffsetPtr[3] / (uint)*(byte *)((long)OffsetPtr + 0x16);
              for (local_120 = 0; local_120 < local_11c; local_120 = local_120 + 1) {
                if (*(char *)((long)OffsetPtr + 0x16) == '\x04') {
                  uVar5 = DataExtractor::getU32(&Data.super_DataExtractor,puStack_20,(Error *)0x0);
                  local_128 = (ulong)uVar5;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (OffsetPtr + 4),&local_128);
                }
                else {
                  local_130 = DataExtractor::getU64
                                        (&Data.super_DataExtractor,puStack_20,(Error *)0x0);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (OffsetPtr + 4),&local_130);
                }
              }
              Error::success();
              Error::Error((Error *)this,&local_138);
              ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_138);
            }
            else {
              invalidateLength((DWARFDebugAddrTable *)OffsetPtr);
              std::error_code::error_code<llvm::errc,void>((error_code *)&I,invalid_argument);
              EC_09._M_cat._0_4_ = I;
              EC_09._0_8_ = this;
              EC_09._M_cat._4_4_ = 0;
              createStringError<unsigned_long,unsigned_int,unsigned_char>
                        (EC_09,(char *)local_110,
                         (unsigned_long *)
                         ".debug_addr table at offset 0x%lx contains data of size %u which is not a multiple of addr size %u"
                         ,(uint *)(OffsetPtr + 1),(uchar *)(OffsetPtr + 3));
            }
          }
          else {
            std::error_code::error_code<llvm::errc,void>(&local_108,not_supported);
            EC_08._M_cat._0_4_ = local_108._M_value;
            EC_08._0_8_ = this;
            EC_08._M_cat._4_4_ = 0;
            createStringError<unsigned_long,unsigned_char>
                      (EC_08,(char *)local_108._M_cat,
                       (unsigned_long *)
                       ".debug_addr table at offset 0x%lx has unsupported segment selector size %u",
                       (uchar *)(OffsetPtr + 1));
          }
        }
        else {
          std::error_code::error_code<llvm::errc,void>(&local_f8,invalid_argument);
          EC_07._M_cat._0_4_ = local_f8._M_value;
          EC_07._0_8_ = this;
          EC_07._M_cat._4_4_ = 0;
          createStringError<unsigned_long,unsigned_char,unsigned_char>
                    (EC_07,(char *)local_f8._M_cat,
                     (unsigned_long *)
                     ".debug_addr table at offset 0x%lx has address size %u which is different from CU address size %u"
                     ,(uchar *)(OffsetPtr + 1),(uchar *)((long)OffsetPtr + 0x16));
        }
      }
      else {
        std::error_code::error_code<llvm::errc,void>(&local_e8,not_supported);
        EC_06._M_cat._0_4_ = local_e8._M_value;
        EC_06._0_8_ = this;
        EC_06._M_cat._4_4_ = 0;
        createStringError<unsigned_long,unsigned_char>
                  (EC_06,(char *)local_e8._M_cat,
                   (unsigned_long *)
                   ".debug_addr table at offset 0x%lx has unsupported address size %u",
                   (uchar *)(OffsetPtr + 1));
      }
    }
    else {
      std::error_code::error_code<llvm::errc,void>(&local_d8,invalid_argument);
      EC_05._M_cat._0_4_ = local_d8._M_value;
      EC_05._0_8_ = this;
      EC_05._M_cat._4_4_ = 0;
      createStringError<unsigned_long,unsigned_short,unsigned_short>
                (EC_05,(char *)local_d8._M_cat,
                 (unsigned_long *)
                 ".debug_addr table at offset 0x%lx has version %u which is different from the version suggested by the DWARF unit header: %u"
                 ,(unsigned_short *)(OffsetPtr + 1),(unsigned_short *)((long)OffsetPtr + 0x14));
    }
  }
  else {
    std::error_code::error_code<llvm::errc,void>(&local_c8,not_supported);
    EC_04._M_cat._0_4_ = local_c8._M_value;
    EC_04._0_8_ = this;
    EC_04._M_cat._4_4_ = 0;
    createStringError<unsigned_short,unsigned_long>
              (EC_04,(char *)local_c8._M_cat,
               (unsigned_short *)
               "version %u of .debug_addr section at offset 0x%lx is not supported",
               (unsigned_long *)((long)OffsetPtr + 0x14));
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFDebugAddrTable::extract(DWARFDataExtractor Data,
                                   uint64_t *OffsetPtr,
                                   uint16_t Version,
                                   uint8_t AddrSize,
                                   std::function<void(Error)> WarnCallback) {
  clear();
  HeaderOffset = *OffsetPtr;
  // Read and verify the length field.
  if (!Data.isValidOffsetForDataOfSize(*OffsetPtr, sizeof(uint32_t)))
    return createStringError(errc::invalid_argument,
                       "section is not large enough to contain a "
                       ".debug_addr table length at offset 0x%"
                       PRIx64, *OffsetPtr);
  uint16_t UnitVersion;
  if (Version == 0) {
    WarnCallback(createStringError(errc::invalid_argument,
                       "DWARF version is not defined in CU,"
                       " assuming version 5"));
    UnitVersion = 5;
  } else {
    UnitVersion = Version;
  }
  // TODO: Add support for DWARF64.
  Format = dwarf::DwarfFormat::DWARF32;
  if (UnitVersion >= 5) {
    HeaderData.Length = Data.getU32(OffsetPtr);
    if (HeaderData.Length == dwarf::DW_LENGTH_DWARF64) {
      invalidateLength();
      return createStringError(errc::not_supported,
          "DWARF64 is not supported in .debug_addr at offset 0x%" PRIx64,
          HeaderOffset);
    }
    if (HeaderData.Length + sizeof(uint32_t) < sizeof(Header)) {
      uint32_t TmpLength = getLength();
      invalidateLength();
      return createStringError(errc::invalid_argument,
                         ".debug_addr table at offset 0x%" PRIx64
                         " has too small length (0x%" PRIx32
                         ") to contain a complete header",
                         HeaderOffset, TmpLength);
    }
    uint64_t End = HeaderOffset + getLength();
    if (!Data.isValidOffsetForDataOfSize(HeaderOffset, End - HeaderOffset)) {
      uint32_t TmpLength = getLength();
      invalidateLength();
      return createStringError(errc::invalid_argument,
          "section is not large enough to contain a .debug_addr table "
          "of length 0x%" PRIx32 " at offset 0x%" PRIx64,
          TmpLength, HeaderOffset);
    }

    HeaderData.Version = Data.getU16(OffsetPtr);
    HeaderData.AddrSize = Data.getU8(OffsetPtr);
    HeaderData.SegSize = Data.getU8(OffsetPtr);
    DataSize = getDataSize();
  } else {
    HeaderData.Version = UnitVersion;
    HeaderData.AddrSize = AddrSize;
    // TODO: Support for non-zero SegSize.
    HeaderData.SegSize = 0;
    DataSize = Data.size();
  }

  // Perform basic validation of the remaining header fields.

  // We support DWARF version 5 for now as well as pre-DWARF5
  // implementations of .debug_addr table, which doesn't contain a header
  // and consists only of a series of addresses.
  if (HeaderData.Version > 5) {
    return createStringError(errc::not_supported, "version %" PRIu16
        " of .debug_addr section at offset 0x%" PRIx64 " is not supported",
        HeaderData.Version, HeaderOffset);
  }
  // FIXME: For now we just treat version mismatch as an error,
  // however the correct way to associate a .debug_addr table
  // with a .debug_info table is to look at the DW_AT_addr_base
  // attribute in the info table.
  if (HeaderData.Version != UnitVersion)
    return createStringError(errc::invalid_argument,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has version %" PRIu16
                       " which is different from the version suggested"
                       " by the DWARF unit header: %" PRIu16,
                       HeaderOffset, HeaderData.Version, UnitVersion);
  if (HeaderData.AddrSize != 4 && HeaderData.AddrSize != 8)
    return createStringError(errc::not_supported,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has unsupported address size %" PRIu8,
                       HeaderOffset, HeaderData.AddrSize);
  if (HeaderData.AddrSize != AddrSize && AddrSize != 0)
    return createStringError(errc::invalid_argument,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has address size %" PRIu8
                       " which is different from CU address size %" PRIu8,
                       HeaderOffset, HeaderData.AddrSize, AddrSize);

  // TODO: add support for non-zero segment selector size.
  if (HeaderData.SegSize != 0)
    return createStringError(errc::not_supported,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has unsupported segment selector size %" PRIu8,
                       HeaderOffset, HeaderData.SegSize);
  if (DataSize % HeaderData.AddrSize != 0) {
    invalidateLength();
    return createStringError(errc::invalid_argument,
                       ".debug_addr table at offset 0x%" PRIx64
                       " contains data of size %" PRIu32
                       " which is not a multiple of addr size %" PRIu8,
                       HeaderOffset, DataSize, HeaderData.AddrSize);
  }
  Data.setAddressSize(HeaderData.AddrSize);
  uint32_t AddrCount = DataSize / HeaderData.AddrSize;
  for (uint32_t I = 0; I < AddrCount; ++I)
    if (HeaderData.AddrSize == 4)
      Addrs.push_back(Data.getU32(OffsetPtr));
    else
      Addrs.push_back(Data.getU64(OffsetPtr));
  return Error::success();
}